

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall
lzham::lzcompressor::node::add_state
          (node *this,int parent_index,int parent_state_index,lzdecision *lzdec,state *parent_state,
          bit_cost_t total_cost,uint total_complexity)

{
  uint *puVar1;
  node_state *pnVar2;
  state_base *psVar3;
  bit_cost_t bVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  state_base local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined7 uStack_40;
  undefined1 uStack_39;
  undefined7 uStack_38;
  undefined1 uStack_31;
  
  local_80.m_cur_ofs = (parent_state->super_state_base).m_cur_ofs;
  local_80.m_cur_state = (parent_state->super_state_base).m_cur_state;
  local_80.m_match_hist._0_8_ = *(undefined8 *)(parent_state->super_state_base).m_match_hist;
  local_80.m_match_hist._8_8_ = *(undefined8 *)((parent_state->super_state_base).m_match_hist + 2);
  state_base::partial_advance(&local_80,lzdec);
  uVar9 = this->m_num_node_states;
  uVar11 = uVar9;
  while( true ) {
    uVar13 = uVar11 - 1;
    if ((int)uVar13 < 0) break;
    pnVar2 = this->m_node_states + uVar13;
    if ((this->m_node_states[uVar13].m_saved_state.m_cur_state == local_80.m_cur_state) &&
       ((pnVar2->m_saved_state).m_match_hist[0] == local_80.m_match_hist[0])) {
      uVar10 = 0;
      do {
        uVar12 = uVar10;
        if (uVar12 == 3) break;
        uVar10 = uVar12 + 1;
      } while (this->m_node_states[uVar13].m_saved_state.m_match_hist[uVar12 + 1] ==
               local_80.m_match_hist[uVar12 + 1]);
      bVar14 = 2 < uVar12;
    }
    else {
      bVar14 = false;
    }
    if ((bVar14) &&
       ((total_cost < pnVar2->m_total_cost ||
        ((pnVar2->m_total_cost == total_cost && (total_complexity < pnVar2->m_total_complexity))))))
    {
      pnVar2->m_parent_index = (int16)parent_index;
      pnVar2->m_parent_state_index = (int8)parent_state_index;
      iVar6 = lzdec->m_len;
      (pnVar2->m_lzdec).m_pos = lzdec->m_pos;
      (pnVar2->m_lzdec).m_len = iVar6;
      (pnVar2->m_lzdec).m_dist = lzdec->m_dist;
      pnVar2->m_total_cost = total_cost;
      pnVar2->m_total_complexity = total_complexity;
      if (uVar13 != 0) {
        puVar8 = &this->m_node_states[(ulong)uVar13 - 1].m_total_complexity;
        do {
          if ((*(ulong *)(puVar8 + -2) <= *(ulong *)(puVar8 + 0xc)) &&
             ((*(ulong *)(puVar8 + 0xc) != *(ulong *)(puVar8 + -2) || (*puVar8 <= puVar8[0xe])))) {
            uVar13 = uVar11 - 1;
            goto LAB_0010b837;
          }
          puVar1 = puVar8 + 2;
          pnVar2 = (node_state *)(puVar8 + -0xc);
          uStack_38 = (undefined7)*(undefined8 *)(puVar8 + 0xe);
          uStack_31 = (undefined1)((ulong)*(undefined8 *)(puVar8 + 0xe) >> 0x38);
          local_68 = *(undefined8 *)puVar1;
          uStack_60 = *(undefined8 *)(puVar8 + 4);
          local_58 = *(undefined8 *)(puVar8 + 6);
          uStack_50 = *(undefined8 *)(puVar8 + 8);
          local_48 = *(undefined8 *)(puVar8 + 10);
          bVar4 = *(bit_cost_t *)(puVar8 + 0xc);
          uStack_40 = (undefined7)bVar4;
          uStack_39 = (undefined1)(bVar4 >> 0x38);
          *(undefined8 *)((long)puVar8 + 0x37) = *(undefined8 *)((long)puVar8 + -1);
          iVar6 = (pnVar2->m_lzdec).m_pos;
          iVar7 = (pnVar2->m_lzdec).m_len;
          uVar5 = *(undefined8 *)(puVar8 + -10);
          *(undefined8 *)(puVar8 + 10) = *(undefined8 *)(puVar8 + -4);
          *(bit_cost_t *)(puVar8 + 0xc) = *(bit_cost_t *)(puVar8 + -2);
          *(undefined8 *)(puVar8 + 6) = *(undefined8 *)(puVar8 + -8);
          *(undefined8 *)(puVar8 + 8) = *(undefined8 *)(puVar8 + -6);
          puVar1[0] = iVar6;
          puVar1[1] = iVar7;
          *(undefined8 *)(puVar8 + 4) = uVar5;
          *(undefined8 *)(puVar8 + -4) = local_48;
          *(bit_cost_t *)(puVar8 + -2) = bVar4;
          *(ulong *)((long)puVar8 + -1) = CONCAT71(uStack_38,uStack_39);
          *(undefined8 *)(puVar8 + -8) = local_58;
          *(undefined8 *)(puVar8 + -6) = uStack_50;
          (pnVar2->m_lzdec).m_pos = (int)local_68;
          (pnVar2->m_lzdec).m_len = (int)((ulong)local_68 >> 0x20);
          *(undefined8 *)(puVar8 + -10) = uStack_60;
          uVar11 = uVar11 - 1;
          puVar8 = puVar8 + -0xe;
        } while (1 < (int)uVar11);
      }
      uVar13 = 0;
    }
LAB_0010b837:
    uVar11 = uVar13;
    if (bVar14) {
      return;
    }
  }
  uVar11 = uVar9;
  if (0 < (int)uVar9) {
    puVar8 = &this->m_node_states[(ulong)uVar9 - 1].m_total_complexity;
    uVar10 = (ulong)uVar9;
    do {
      if ((*(ulong *)(puVar8 + -2) < total_cost) ||
         ((*(ulong *)(puVar8 + -2) == total_cost && (*puVar8 <= total_complexity)))) {
        uVar11 = (uint)uVar10;
        goto LAB_0010b880;
      }
      puVar8 = puVar8 + -0xe;
      bVar14 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar14);
    uVar11 = 0;
  }
LAB_0010b880:
  if (uVar11 != 4) {
    uVar9 = (uVar9 - uVar11) - (uint)(3 < uVar9);
    if (uVar9 != 0) {
      memmove(this->m_node_states + (int)(uVar11 + 1),this->m_node_states + (int)uVar11,
              (ulong)uVar9 * 0x38);
    }
    this->m_node_states[(int)uVar11].m_parent_index = (int16)parent_index;
    this->m_node_states[(int)uVar11].m_parent_state_index = (int8)parent_state_index;
    iVar6 = lzdec->m_len;
    this->m_node_states[(int)uVar11].m_lzdec.m_pos = lzdec->m_pos;
    this->m_node_states[(int)uVar11].m_lzdec.m_len = iVar6;
    this->m_node_states[(int)uVar11].m_lzdec.m_dist = lzdec->m_dist;
    this->m_node_states[(int)uVar11].m_total_cost = total_cost;
    this->m_node_states[(int)uVar11].m_total_complexity = total_complexity;
    psVar3 = &this->m_node_states[(int)uVar11].m_saved_state;
    psVar3->m_cur_ofs = local_80.m_cur_ofs;
    psVar3->m_cur_state = local_80.m_cur_state;
    *(undefined8 *)psVar3->m_match_hist = local_80.m_match_hist._0_8_;
    *(undefined8 *)(this->m_node_states[(int)uVar11].m_saved_state.m_match_hist + 2) =
         local_80.m_match_hist._8_8_;
    uVar11 = this->m_num_node_states + 1;
    uVar9 = 4;
    if (uVar11 < 4) {
      uVar9 = uVar11;
    }
    this->m_num_node_states = uVar9;
  }
  return;
}

Assistant:

void lzcompressor::node::add_state(
      int parent_index, int parent_state_index,
      const lzdecision &lzdec, state &parent_state,
      bit_cost_t total_cost,
      uint total_complexity)
   {
      state_base trial_state;
      parent_state.save_partial_state(trial_state);
      trial_state.partial_advance(lzdec);

      for (int i = m_num_node_states - 1; i >= 0; i--)
      {
         node_state &cur_node_state = m_node_states[i];
         if (cur_node_state.m_saved_state == trial_state)
         {
            if ( (total_cost < cur_node_state.m_total_cost) ||
                 ((total_cost == cur_node_state.m_total_cost) && (total_complexity < cur_node_state.m_total_complexity)) )
            {
               cur_node_state.m_parent_index = static_cast<int16>(parent_index);
               cur_node_state.m_parent_state_index = static_cast<int8>(parent_state_index);
               cur_node_state.m_lzdec = lzdec;
               cur_node_state.m_total_cost = total_cost;
               cur_node_state.m_total_complexity = total_complexity;

               while (i > 0)
               {
                  if ((m_node_states[i].m_total_cost < m_node_states[i - 1].m_total_cost) ||
                      ((m_node_states[i].m_total_cost == m_node_states[i - 1].m_total_cost) && (m_node_states[i].m_total_complexity < m_node_states[i - 1].m_total_complexity)))
                  {
                     std::swap(m_node_states[i], m_node_states[i - 1]);
                     i--;
                  }
                  else
                     break;
               }
            }

            return;
         }
      }

      int insert_index;
      for (insert_index = m_num_node_states; insert_index > 0; insert_index--)
      {
         node_state &cur_node_state = m_node_states[insert_index - 1];

         if ( (total_cost > cur_node_state.m_total_cost) ||
              ((total_cost == cur_node_state.m_total_cost) && (total_complexity >= cur_node_state.m_total_complexity)) )
         {
            break;
         }
      }

      if (insert_index == cMaxNodeStates)
         return;

      uint num_behind = m_num_node_states - insert_index;
      uint num_to_move = (m_num_node_states < cMaxNodeStates) ? num_behind : (num_behind - 1);
      if (num_to_move)
      {
         LZHAM_ASSERT((insert_index + 1 + num_to_move) <= cMaxNodeStates);
         memmove( &m_node_states[insert_index + 1], &m_node_states[insert_index], sizeof(node_state) * num_to_move);
      }

      node_state *pNew_node_state = &m_node_states[insert_index];
      pNew_node_state->m_parent_index = static_cast<int16>(parent_index);
      pNew_node_state->m_parent_state_index = static_cast<uint8>(parent_state_index);
      pNew_node_state->m_lzdec = lzdec;
      pNew_node_state->m_total_cost = total_cost;
      pNew_node_state->m_total_complexity = total_complexity;
      pNew_node_state->m_saved_state = trial_state;

      m_num_node_states = LZHAM_MIN(m_num_node_states + 1, cMaxNodeStates);

#ifdef LZHAM_LZVERIFY
      for (uint i = 0; i < (m_num_node_states - 1); ++i)
      {
         node_state &a = m_node_states[i];
         node_state &b = m_node_states[i + 1];
         LZHAM_VERIFY(
            (a.m_total_cost < b.m_total_cost) ||
            ((a.m_total_cost == b.m_total_cost) && (a.m_total_complexity <= b.m_total_complexity)) );
      }
#endif
   }